

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O1

bool __thiscall mp::NLSuffix::operator<(NLSuffix *this,NLSuffix *s)

{
  pointer pcVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  difference_type __d;
  long *local_80;
  ulong local_78;
  long local_70 [2];
  uint local_60;
  long *local_58;
  ulong local_50;
  long local_48 [2];
  uint local_38;
  
  uVar2 = this->kind_;
  local_80 = local_70;
  pcVar1 = (this->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (this->name_)._M_string_length);
  uVar6 = s->kind_;
  pcVar1 = (s->name_)._M_dataplus._M_p;
  local_60 = uVar2 & 3;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (s->name_)._M_string_length);
  uVar6 = uVar6 & 3;
  uVar4 = local_78;
  if (local_50 < local_78) {
    uVar4 = local_50;
  }
  local_38 = uVar6;
  if (uVar4 == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = memcmp(local_80,local_58,uVar4);
    uVar3 = (ulong)uVar2;
  }
  if ((int)uVar3 == 0) {
    uVar3 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_78 - local_50)) {
      uVar3 = local_78 - local_50;
    }
    if (0x7ffffffe < (long)uVar3) {
      uVar3 = 0x7fffffff;
    }
  }
  if ((int)uVar3 < 0) {
    bVar5 = true;
  }
  else {
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      uVar2 = memcmp(local_58,local_80,uVar4);
      uVar4 = (ulong)uVar2;
    }
    if ((int)uVar4 == 0) {
      uVar4 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_50 - local_78)) {
        uVar4 = local_50 - local_78;
      }
      if (0x7ffffffe < (long)uVar4) {
        uVar4 = 0x7fffffff;
      }
    }
    if ((int)uVar4 < 0) {
      bVar5 = false;
    }
    else {
      bVar5 = (int)local_60 < (int)uVar6;
    }
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return bVar5;
}

Assistant:

bool operator<(const NLSuffix& s) const {
    return std::make_pair(name_, kind_&3)
        < std::make_pair(s.name_, s.kind_&3);
  }